

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O1

void Abc_TruthDecPerform(Abc_TtStore_t *p,int DecType,int fVerbose)

{
  word *pInit;
  bool bVar1;
  int iVar2;
  int iVar3;
  Vec_Str_t *vStr;
  Vec_Int_t *vCover;
  int *piVar4;
  Dec_Graph_t *pGraph;
  Bdc_Man_t *p_00;
  Kit_DsdNtk_t *pNtk;
  byte bVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  int iVar15;
  word *pwVar16;
  int nVars;
  ulong uVar17;
  uint uVar18;
  word *pwVar19;
  word *tLimit;
  timespec ts;
  char *in_stack_fffffffffffff7c8;
  timespec local_808 [125];
  
  iVar2 = clock_gettime(3,local_808);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_808[0].tv_nsec._4_4_,(undefined4)local_808[0].tv_nsec)),8)
    ;
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_808[0].tv_sec * -1000000;
  }
  if (DecType == 1) {
    pcVar14 = "factoring";
    goto LAB_0025a6e2;
  }
  switch(DecType) {
  case 2:
    pcVar14 = "bi-decomp";
    break;
  case 3:
    pcVar14 = "DSD";
    break;
  case 4:
    pcVar14 = "fast DSD";
    break;
  case 5:
    pcVar14 = "analysis";
    break;
  default:
    bVar1 = true;
    pcVar14 = (char *)0x0;
    goto LAB_0025a6e4;
  }
LAB_0025a6e2:
  bVar1 = false;
LAB_0025a6e4:
  if (!bVar1) {
    pcVar6 = "s";
    if (p->nFuncs == 1) {
      pcVar6 = "";
    }
    printf("Applying %-10s to %8d func%s of %2d vars...  ",pcVar14,(ulong)(uint)p->nFuncs,pcVar6);
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  if (DecType == 1) {
    vStr = (Vec_Str_t *)malloc(0x10);
    vStr->nCap = 10000;
    vStr->nSize = 0;
    pcVar14 = (char *)malloc(10000);
    vStr->pArray = pcVar14;
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar4 = (int *)malloc(0x40000);
    vCover->pArray = piVar4;
    if (p->nFuncs < 1) {
      uVar18 = 0;
    }
    else {
      uVar10 = 0;
      uVar18 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar10 & 0xffffffff);
        }
        pcVar14 = Kit_PlaFromTruthNew((uint *)p->pFuncs[uVar10],p->nVars,vCover,vStr);
        pGraph = Dec_Factor(pcVar14);
        uVar18 = (uVar18 + pGraph->nSize) - pGraph->nLeaves;
        if (fVerbose != 0) {
          Dec_GraphPrint(_stdout,pGraph,(char **)0x0,(char *)0x0);
        }
        if (pGraph->pNodes != (Dec_Node_t *)0x0) {
          free(pGraph->pNodes);
          pGraph->pNodes = (Dec_Node_t *)0x0;
        }
        if (pGraph != (Dec_Graph_t *)0x0) {
          free(pGraph);
        }
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)p->nFuncs);
    }
    if (vCover->pArray != (int *)0x0) {
      free(vCover->pArray);
      vCover->pArray = (int *)0x0;
    }
    free(vCover);
    if (vStr->pArray != (char *)0x0) {
      free(vStr->pArray);
      vStr->pArray = (char *)0x0;
    }
    free(vStr);
  }
  else {
    switch(DecType) {
    case 2:
      local_808[0].tv_nsec._0_4_ = 0;
      local_808[0].tv_sec = (__time_t)(uint)p->nVars;
      p_00 = Bdc_ManAlloc((Bdc_Par_t *)local_808);
      if (p->nFuncs < 1) {
        uVar18 = 0;
      }
      else {
        uVar10 = 0;
        uVar18 = 0;
        do {
          if (fVerbose != 0) {
            printf("%7d :      ",uVar10 & 0xffffffff);
          }
          Bdc_ManDecompose(p_00,(uint *)p->pFuncs[uVar10],(uint *)0x0,p->nVars,(Vec_Ptr_t *)0x0,1000
                          );
          iVar2 = Bdc_ManAndNum(p_00);
          if (fVerbose != 0) {
            Bdc_ManDecPrint(p_00);
          }
          uVar18 = uVar18 + iVar2;
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)p->nFuncs);
      }
      Bdc_ManFree(p_00);
      goto LAB_0025ac59;
    case 3:
      if (0 < p->nFuncs) {
        uVar10 = 0;
        uVar18 = 0;
        do {
          if (fVerbose != 0) {
            printf("%7d :      ",uVar10 & 0xffffffff);
          }
          pNtk = Kit_DsdDecomposeMux((uint *)p->pFuncs[uVar10],p->nVars,3);
          if (fVerbose != 0) {
            Kit_DsdPrintExpanded(pNtk);
            putchar(10);
          }
          iVar2 = Kit_DsdCountAigNodes(pNtk);
          uVar18 = uVar18 + iVar2;
          Kit_DsdNtkFree(pNtk);
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)p->nFuncs);
        goto LAB_0025ac59;
      }
      break;
    case 4:
      if (0 < p->nFuncs) {
        uVar10 = 0;
        uVar18 = 0;
        do {
          if (fVerbose == 0) {
            Dau_DsdDecompose(p->pFuncs[uVar10],p->nVars,0,1,(char *)local_808);
          }
          else {
            printf("%7d :      ",uVar10 & 0xffffffff);
            Dau_DsdDecompose(p->pFuncs[uVar10],p->nVars,0,1,(char *)local_808);
            puts((char *)local_808);
          }
          iVar2 = Dau_DsdCountAnds(in_stack_fffffffffffff7c8);
          uVar18 = uVar18 + iVar2;
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)p->nFuncs);
        goto LAB_0025ac59;
      }
      break;
    case 5:
      if (0 < p->nFuncs) {
        uVar10 = 0;
        do {
          pInit = p->pFuncs[uVar10];
          iVar2 = p->nVars;
          nVars = 0;
          if (0 < (long)iVar2) {
            iVar3 = iVar2 + -6;
            uVar7 = 1 << ((byte)iVar3 & 0x1f);
            uVar18 = uVar7;
            if ((int)uVar7 < 2) {
              uVar18 = 1;
            }
            uVar9 = 0;
            nVars = 0;
            do {
              if (iVar2 < 7) {
                uVar13 = (uint)((s_Truths6Neg[uVar9] &
                                (*pInit >> ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^ *pInit)) !=
                               0);
              }
              else {
                uVar13 = 0;
                if (uVar9 < 6) {
                  if (iVar3 != 0x1f) {
                    uVar11 = 0;
                    do {
                      if (((pInit[uVar11] >> ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^
                           pInit[uVar11]) & s_Truths6Neg[uVar9]) != 0) {
                        uVar13 = 1;
                        break;
                      }
                      uVar11 = uVar11 + 1;
                      uVar13 = 0;
                    } while (uVar18 != uVar11);
                  }
                }
                else if (iVar3 != 0x1f) {
                  bVar5 = (byte)(uVar9 - 6);
                  uVar13 = 1 << (bVar5 & 0x1f);
                  iVar15 = 2 << (bVar5 & 0x1f);
                  uVar11 = 1;
                  if (1 < (int)uVar13) {
                    uVar11 = (ulong)uVar13;
                  }
                  pwVar19 = pInit + (int)uVar13;
                  pwVar16 = pInit;
                  do {
                    if (uVar9 - 6 != 0x1f) {
                      uVar17 = 0;
                      do {
                        if (pwVar16[uVar17] != pwVar19[uVar17]) {
                          uVar13 = 1;
                          goto LAB_0025aa60;
                        }
                        uVar17 = uVar17 + 1;
                      } while (uVar11 != uVar17);
                    }
                    pwVar16 = pwVar16 + iVar15;
                    pwVar19 = pwVar19 + iVar15;
                    uVar13 = 0;
                  } while (pwVar16 < pInit + (int)uVar7);
                }
              }
LAB_0025aa60:
              nVars = nVars + uVar13;
              uVar9 = uVar9 + 1;
            } while (uVar9 != (long)iVar2);
          }
          if (fVerbose == 0) {
            Dau_DecTrySets(pInit,nVars,0);
          }
          else {
            printf("%7d :      ",uVar10 & 0xffffffff);
            Dau_DecTrySets(p->pFuncs[uVar10],nVars,fVerbose);
            putchar(10);
          }
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)p->nFuncs);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDec.c"
                    ,0x245,"void Abc_TruthDecPerform(Abc_TtStore_t *, int, int)");
    }
    uVar18 = 0;
  }
LAB_0025ac59:
  printf("AIG nodes =%9d  ",(ulong)uVar18);
  iVar2 = clock_gettime(3,local_808);
  if (iVar2 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = CONCAT44(local_808[0].tv_nsec._4_4_,(undefined4)local_808[0].tv_nsec) / 1000 +
             local_808[0].tv_sec * 1000000;
  }
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar12 + lVar8) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthDecPerform( Abc_TtStore_t * p, int DecType, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, nNodes = 0;

    char * pAlgoName = NULL;
    if ( DecType == 1 )
        pAlgoName = "factoring";
    else if ( DecType == 2 )
        pAlgoName = "bi-decomp";
    else if ( DecType == 3 )
        pAlgoName = "DSD";
    else if ( DecType == 4 )
        pAlgoName = "fast DSD";
    else if ( DecType == 5 )
        pAlgoName = "analysis";

    if ( pAlgoName )
        printf( "Applying %-10s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( DecType == 1 )
    {
        // perform algebraic factoring and count AIG nodes
        Dec_Graph_t * pFForm;
        Vec_Int_t * vCover;
        Vec_Str_t * vStr;
        char * pSopStr;
        vStr = Vec_StrAlloc( 10000 );
        vCover = Vec_IntAlloc( 1 << 16 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
//            extern int Abc_IsopTest( word * pFunc, int nVars, Vec_Int_t * vCover );
//            if ( i == 0 ) printf( "\n" );
//            Abc_IsopTest( p->pFuncs[i], p->nVars, vCover );
//            continue;
            if ( fVerbose )
                printf( "%7d : ", i );
            pSopStr = Kit_PlaFromTruthNew( (unsigned *)p->pFuncs[i], p->nVars, vCover, vStr );
            pFForm = Dec_Factor( pSopStr );
            nNodes += Dec_GraphNodeNum( pFForm );
            if ( fVerbose )
                Dec_GraphPrint( stdout, pFForm, NULL, NULL );
            Dec_GraphFree( pFForm );
        }
        Vec_IntFree( vCover );
        Vec_StrFree( vStr );
    }
    else if ( DecType == 2 )
    {
        // perform bi-decomposition and count AIG nodes
        Bdc_Man_t * pManDec;
        Bdc_Par_t Pars = {0}, * pPars = &Pars;
        pPars->nVarsMax = p->nVars;
        pManDec = Bdc_ManAlloc( pPars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Bdc_ManDecompose( pManDec, (unsigned *)p->pFuncs[i], NULL, p->nVars, NULL, 1000 );
            nNodes += Bdc_ManAndNum( pManDec );
            if ( fVerbose )
                Bdc_ManDecPrint( pManDec );
        }
        Bdc_ManFree( pManDec );
    }
    else if ( DecType == 3 )
    {
        // perform disjoint-support decomposition and count AIG nodes
        // (non-DSD blocks are decomposed into 2:1 MUXes, each counting as 3 AIG nodes)
        Kit_DsdNtk_t * pNtk;
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            pNtk = Kit_DsdDecomposeMux( (unsigned *)p->pFuncs[i], p->nVars, 3 );
            if ( fVerbose )
                Kit_DsdPrintExpanded( pNtk ), printf( "\n" );
            nNodes += Kit_DsdCountAigNodes( pNtk );
            Kit_DsdNtkFree( pNtk );
        }
    }
    else if ( DecType == 4 )
    {
        char pDsd[DAU_MAX_STR];
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, 1, pDsd );
            if ( fVerbose )
                printf( "%s\n", pDsd );
            nNodes += Dau_DsdCountAnds( pDsd );
        }
    }
    else if ( DecType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            extern void Dau_DecTrySets( word * pInit, int nVars, int fVerbose );
            int nSuppSize = Abc_TtSupportSize( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DecTrySets( p->pFuncs[i], nSuppSize, fVerbose );
            if ( fVerbose )
                printf( "\n" );
        }
    }
    else assert( 0 );

    printf( "AIG nodes =%9d  ", nNodes );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}